

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiWindowSettings * ImGui::FindWindowSettings(ImGuiID id)

{
  char *pcVar1;
  ImGuiWindowSettings *p;
  ImChunkStream<ImGuiWindowSettings> *this;
  
  pcVar1 = (GImGui->SettingsWindows).Buf.Data;
  p = (ImGuiWindowSettings *)(pcVar1 + 4);
  if (pcVar1 == (char *)0x0) {
    p = (ImGuiWindowSettings *)0x0;
  }
  else {
    this = &GImGui->SettingsWindows;
    do {
      if (p->ID == id) {
        return p;
      }
      p = ImChunkStream<ImGuiWindowSettings>::next_chunk(this,p);
    } while (p != (ImGuiWindowSettings *)0x0);
  }
  return p;
}

Assistant:

ImGuiWindowSettings* ImGui::FindWindowSettings(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
        if (settings->ID == id)
            return settings;
    return NULL;
}